

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyInteger4Mask
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,bool enableRef0,
          GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,GLint reference3,
          bool enableRef3)

{
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_250;
  float local_244;
  char *local_240;
  char *local_238;
  float local_22c;
  char *local_228;
  char *local_220;
  float local_214;
  char *local_210;
  char *local_208;
  float local_1fc;
  char *local_1f8 [3];
  MessageBuilder local_1e0;
  undefined1 local_5c [8];
  StateQueryMemoryWriteGuard<float[4]> floatVector4;
  bool enableRef3_local;
  bool enableRef2_local;
  bool enableRef1_local;
  GLint reference1_local;
  bool enableRef0_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetFloatVerifier *this_local;
  
  floatVector4.m_postguard[2]._3_1_ = enableRef1;
  floatVector4.m_postguard[2]._2_1_ = enableRef2;
  floatVector4.m_postguard[2]._1_1_ = enableRef3;
  floatVector4.m_postguard[3] = (float)reference1;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[4]> *)local_5c);
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  glu::CallLogWrapper::glGetFloatv(&(this->super_StateVerifier).super_CallLogWrapper,name,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[4]> *)local_5c,testCtx);
  if (!bVar1) {
    return;
  }
  if (enableRef0) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    if (((*pafVar3)[0] != (float)reference0) || (NAN((*pafVar3)[0]) || NAN((float)reference0)))
    goto LAB_0062268c;
  }
  if ((floatVector4.m_postguard[2]._3_1_ & 1) != 0) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    if (((*pafVar3)[1] != (float)(int)floatVector4.m_postguard[3]) ||
       (NAN((*pafVar3)[1]) || NAN((float)(int)floatVector4.m_postguard[3]))) goto LAB_0062268c;
  }
  if ((floatVector4.m_postguard[2]._2_1_ & 1) != 0) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    if (((*pafVar3)[2] != (float)reference2) || (NAN((*pafVar3)[2]) || NAN((float)reference2)))
    goto LAB_0062268c;
  }
  if ((floatVector4.m_postguard[2]._1_1_ & 1) == 0) {
    return;
  }
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  if (((*pafVar3)[3] == (float)reference3) && (!NAN((*pafVar3)[3]) && !NAN((float)reference3))) {
    return;
  }
LAB_0062268c:
  this_00 = tcu::TestContext::getLog(testCtx);
  tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [20])"// ERROR: expected ");
  local_1f8[0] = "(";
  if (enableRef0) {
    local_1f8[0] = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1f8);
  local_1fc = (float)reference0;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1fc);
  local_208 = ")";
  if (enableRef0) {
    local_208 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_208);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
  local_210 = "(";
  if ((floatVector4.m_postguard[2]._3_1_ & 1) != 0) {
    local_210 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_210);
  local_214 = (float)(int)floatVector4.m_postguard[3];
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_214);
  local_220 = ")";
  if ((floatVector4.m_postguard[2]._3_1_ & 1) != 0) {
    local_220 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_220);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
  local_228 = "(";
  if ((floatVector4.m_postguard[2]._2_1_ & 1) != 0) {
    local_228 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_228);
  local_22c = (float)reference2;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_22c);
  local_238 = ")";
  if ((floatVector4.m_postguard[2]._2_1_ & 1) != 0) {
    local_238 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_238);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0xafd70f);
  local_240 = "(";
  if ((floatVector4.m_postguard[2]._1_1_ & 1) != 0) {
    local_240 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_240);
  local_244 = (float)reference3;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_244);
  local_250 = ")";
  if ((floatVector4.m_postguard[2]._1_1_ & 1) != 0) {
    local_250 = "";
  }
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_250);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  qVar2 = tcu::TestContext::getTestResult(testCtx);
  if (qVar2 == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (floatVector4[0] != GLfloat(reference0))) ||
		(enableRef1 && (floatVector4[1] != GLfloat(reference1))) ||
		(enableRef2 && (floatVector4[2] != GLfloat(reference2))) ||
		(enableRef3 && (floatVector4[3] != GLfloat(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << GLfloat(reference0) << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << GLfloat(reference1) << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << GLfloat(reference2) << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << GLfloat(reference3) << (enableRef3?"":")") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}